

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O1

int __thiscall InvertDatabase::make_l2_pass(InvertDatabase *this)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int pnum;
  long lVar4;
  long lVar5;
  long lVar6;
  int l2cnt;
  int local_44;
  long local_40;
  value_type_conflict4 local_38 [2];
  
  local_44 = 0;
  iVar1 = ClassInfo::get_num_class
                    ((this->cls).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::resize(&this->set_sup,(long)this->numfreq);
  std::
  vector<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::resize(&this->seq_sup,(long)this->numfreq);
  if (0 < this->numfreq) {
    lVar6 = 0;
    do {
      uVar2 = (ulong)(uint)this->numfreq;
      if ((int)lVar6 < this->numfreq) {
        lVar6 = (long)(int)lVar6;
        do {
          uVar3 = (uint)lVar6;
          local_40 = lVar6;
          if (((int)(uVar3 - (int)uVar2) < -1) &&
             (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->max_iset_len)) {
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::resize((this->set_sup).
                     super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar6,
                     (long)(int)((int)uVar2 + ~uVar3));
            if ((int)(uVar3 - this->numfreq) < -1) {
              lVar4 = 0;
              lVar5 = 0;
              do {
                local_38[1] = 0;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           (*(long *)&(this->set_sup).
                                      super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data + lVar4),(long)iVar1,
                           local_38 + 1);
                lVar5 = lVar5 + 1;
                lVar4 = lVar4 + 0x18;
              } while (lVar5 < (int)(this->numfreq + ~uVar3));
            }
          }
          lVar6 = local_40;
          if ((1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->max_seq_len) &&
             (std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::resize((this->seq_sup).
                       super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + local_40,(long)this->numfreq),
             0 < this->numfreq)) {
            lVar4 = 0;
            lVar5 = 0;
            do {
              local_38[0] = 0;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         (*(long *)&(this->seq_sup).
                                    super__Vector_base<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    ._M_impl.super__Vector_impl_data + lVar4),(long)iVar1,local_38);
              lVar5 = lVar5 + 1;
              lVar4 = lVar4 + 0x18;
            } while (lVar5 < this->numfreq);
          }
          lVar6 = local_40 + 1;
          uVar2 = (ulong)this->numfreq;
        } while (lVar6 < (long)uVar2);
      }
      if (0 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              num_partitions) {
        pnum = 0;
        do {
          process_invert(this,pnum);
          pnum = pnum + 1;
        } while (pnum < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->num_partitions);
      }
      get_F2(this,&local_44);
    } while ((int)lVar6 < this->numfreq);
  }
  return local_44;
}

Assistant:

int InvertDatabase::make_l2_pass() {
    int i, j;

    int l2cnt = 0;
    int num_class = cls->get_num_class();

    // support for 2-itemsets
    set_sup.resize(numfreq);
    seq_sup.resize(numfreq);

    int low, high;

    for (low = 0; low < numfreq; low = high) {
        for (high = low; high < numfreq; high++) {
            if (args->max_iset_len > 1 && numfreq - high - 1 > 0) {
                set_sup[high].resize(numfreq - high - 1);
                for (i = 0; i < numfreq - high - 1; i++) {
                    set_sup[high][i].resize(num_class, 0);
                }
            }
            if (args->max_seq_len > 1) {
                seq_sup[high].resize(numfreq);
                for (i = 0; i < numfreq; i++) {
                    seq_sup[high][i].resize(num_class, 0);
                }
            }
        }
        for (int p = 0; p < args->num_partitions; p++) {
            process_invert(p);
        }
        get_F2(l2cnt);
    }

    return l2cnt;
}